

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rldata.hpp
# Opt level: O1

bool __thiscall relive::Station::needsUpdate(Station *this,Station *ns)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (((this->_reliveId == ns->_reliveId) && (this->_protocol == ns->_protocol)) &&
     (sVar1 = (this->_name)._M_string_length, sVar1 == (ns->_name)._M_string_length)) {
    if ((sVar1 != 0) &&
       (iVar2 = bcmp((this->_name)._M_dataplus._M_p,(ns->_name)._M_dataplus._M_p,sVar1), iVar2 != 0)
       ) {
      return true;
    }
    if ((this->_flags == ns->_flags) &&
       (sVar1 = (this->_metaInfo)._M_string_length, sVar1 == (ns->_metaInfo)._M_string_length)) {
      if (sVar1 == 0) {
        bVar3 = false;
      }
      else {
        iVar2 = bcmp((this->_metaInfo)._M_dataplus._M_p,(ns->_metaInfo)._M_dataplus._M_p,sVar1);
        bVar3 = iVar2 != 0;
      }
    }
  }
  return bVar3;
}

Assistant:

bool needsUpdate(const Station& ns)
    {
        return (_reliveId != ns._reliveId || _protocol != ns._protocol || _name != ns._name || _flags != ns._flags || _metaInfo != ns._metaInfo);
    }